

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RegexMatcher::group
          (UnicodeString *__return_storage_ptr__,RegexMatcher *this,int32_t groupNum,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t start;
  int64_t limit;
  char16_t *dest;
  int32_t extractLength;
  UChar *buf;
  int32_t length;
  int64_t groupEnd;
  int64_t groupStart;
  UErrorCode *status_local;
  int32_t groupNum_local;
  RegexMatcher *this_local;
  UnicodeString *result;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  start = start64(this,groupNum,status);
  limit = end64(this,groupNum,status);
  UVar1 = ::U_FAILURE(*status);
  if ((((UVar1 == '\0') && (start != -1)) && (start != limit)) &&
     (iVar2 = utext_extract_63(this->fInputText,start,limit,(UChar *)0x0,0,status),
     *status == U_BUFFER_OVERFLOW_ERROR)) {
    *status = U_ZERO_ERROR;
    dest = icu_63::UnicodeString::getBuffer(__return_storage_ptr__,iVar2);
    if (dest == (char16_t *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      iVar2 = utext_extract_63(this->fInputText,start,limit,dest,iVar2,status);
      icu_63::UnicodeString::releaseBuffer(__return_storage_ptr__,iVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexMatcher::group(int32_t groupNum, UErrorCode &status) const {
    UnicodeString result;
    int64_t groupStart = start64(groupNum, status);
    int64_t groupEnd = end64(groupNum, status);
    if (U_FAILURE(status) || groupStart == -1 || groupStart == groupEnd) {
        return result;
    }

    // Get the group length using a utext_extract preflight.
    //    UText is actually pretty efficient at this when underlying encoding is UTF-16.
    int32_t length = utext_extract(fInputText, groupStart, groupEnd, NULL, 0, &status);
    if (status != U_BUFFER_OVERFLOW_ERROR) {
        return result;
    }

    status = U_ZERO_ERROR;
    UChar *buf = result.getBuffer(length);
    if (buf == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        int32_t extractLength = utext_extract(fInputText, groupStart, groupEnd, buf, length, &status);
        result.releaseBuffer(extractLength);
        U_ASSERT(length == extractLength);
    }
    return result;
}